

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

void __thiscall
dtc::anon_unknown_1::binary_operator<13,_std::logical_and<unsigned_long_long>_>::binary_operator
          (binary_operator<13,_std::logical_and<unsigned_long_long>_> *this,source_location *l,
          char *o)

{
  text_input_buffer *ptVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  bool bVar4;
  
  ptVar1 = l->buffer;
  peVar2 = (l->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (l->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = l->cursor;
    (this->super_binary_operator_base).super_expression.loc.buffer = ptVar1;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_binary_operator_base).super_expression.loc.cursor = iVar3;
    (this->super_binary_operator_base).lhs._M_t.
    super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
    ._M_t.
    super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
    .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl =
         (expression *)0x0;
    (this->super_binary_operator_base).rhs._M_t.
    super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
    ._M_t.
    super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
    .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl =
         (expression *)0x0;
    goto LAB_001379a7;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded != '\0';
    iVar3 = l->cursor;
    (this->super_binary_operator_base).super_expression._vptr_expression =
         (_func_int **)&PTR___cxa_pure_virtual_001484d8;
    (this->super_binary_operator_base).super_expression.loc.buffer = ptVar1;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (bVar4) goto LAB_0013798b;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    iVar3 = l->cursor;
    (this->super_binary_operator_base).super_expression.loc.buffer = ptVar1;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_binary_operator_base).super_expression.loc.b.
    super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
LAB_0013798b:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  (this->super_binary_operator_base).super_expression.loc.cursor = iVar3;
  (this->super_binary_operator_base).super_expression._vptr_expression =
       (_func_int **)&PTR___cxa_pure_virtual_00148708;
  (this->super_binary_operator_base).lhs._M_t.
  super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl =
       (expression *)0x0;
  (this->super_binary_operator_base).rhs._M_t.
  super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
  .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl =
       (expression *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_001379a7:
  (this->super_binary_operator_base).super_expression._vptr_expression =
       (_func_int **)&PTR_operator___00148b30;
  this->opName = "&&";
  return;
}

Assistant:

binary_operator(source_location l, const char *o) :
		binary_operator_base(l), opName(o) {}